

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctive.cpp
# Opt level: O3

bool __thiscall DisjunctiveEF::propagate(DisjunctiveEF *this)

{
  uint uVar1;
  int *piVar2;
  _Iter_comp_iter<DisjunctiveEF::SortEstAsc> __comp;
  _Iter_comp_iter<DisjunctiveEF::SortLetDsc> __comp_00;
  long lVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  
  (this->super_Propagator).field_0x12 = 0;
  uVar1 = (this->x).sz;
  uVar6 = (ulong)uVar1;
  if (uVar6 != 0) {
    piVar2 = this->ests;
    __comp._M_comp.p = (SortEstAsc)(this->sort_est_asc).p;
    lVar3 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar1 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<DisjunctiveEF::SortEstAsc>>
              (piVar2,piVar2 + uVar6,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,__comp);
    std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<DisjunctiveEF::SortEstAsc>>
              (piVar2,piVar2 + uVar6,__comp);
    uVar1 = (this->x).sz;
    uVar6 = (ulong)uVar1;
    if (uVar6 != 0) {
      piVar2 = this->lets;
      __comp_00._M_comp.p = (SortLetDsc)(this->sort_let_dsc).p;
      lVar3 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar1 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<DisjunctiveEF::SortLetDsc>>
                (piVar2,piVar2 + uVar6,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,__comp_00);
      std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<DisjunctiveEF::SortLetDsc>>
                (piVar2,piVar2 + uVar6,__comp_00);
    }
  }
  if (so.disj_edge_find == true) {
    bVar4 = doEdgeFinding(this);
    if (bVar4) goto LAB_00169329;
LAB_00169342:
    bVar4 = false;
  }
  else {
LAB_00169329:
    if (so.disj_set_bp == true) {
      iVar5 = (*(this->bp->super_Propagator)._vptr_Propagator[3])();
      if ((char)iVar5 == '\0') goto LAB_00169342;
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool propagate() override {
		trailed_pinfo_sz = false;

		// sort vars based on est and let
		std::sort(ests, ests + x.size(), sort_est_asc);
		std::sort(lets, lets + x.size(), sort_let_dsc);

		//		if (!findBasicPrecedences()) return false;
		if (so.disj_edge_find && !doEdgeFinding()) {
			return false;
		}
		if (so.disj_set_bp && !bp->propagate()) {
			return false;
		}

		return true;
	}